

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_decode_bin(char **data,uint32_t *len)

{
  char cVar1;
  ushort uVar2;
  char *pcVar3;
  uint uVar4;
  
  if (len == (uint32_t *)0x0) {
    __assert_fail("len != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x83d,"const char *mp_decode_bin(const char **, uint32_t *)");
  }
  pcVar3 = *data;
  cVar1 = *pcVar3;
  *data = pcVar3 + 1;
  if (cVar1 == -0x3a) {
    uVar4 = *(uint *)(pcVar3 + 1);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    pcVar3 = pcVar3 + 5;
  }
  else {
    if (cVar1 == -0x3b) {
      uVar2 = *(ushort *)(pcVar3 + 1);
      *data = pcVar3 + 3;
      uVar4 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
      goto LAB_0011657e;
    }
    if (cVar1 != -0x3c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0x836,"uint32_t mp_decode_binl(const char **)");
    }
    uVar4 = (uint)(byte)pcVar3[1];
    pcVar3 = pcVar3 + 2;
  }
  *data = pcVar3;
LAB_0011657e:
  *len = uVar4;
  pcVar3 = *data;
  *data = pcVar3 + uVar4;
  return pcVar3;
}

Assistant:

MP_IMPL const char *
mp_decode_bin(const char **data, uint32_t *len)
{
	assert(len != NULL);

	*len = mp_decode_binl(data);
	const char *str = *data;
	*data += *len;
	return str;
}